

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-docstate.c
# Opt level: O3

fy_document_state * fy_document_state_alloc(void)

{
  fy_document_state *pfVar1;
  
  pfVar1 = (fy_document_state *)calloc(1,0x58);
  if (pfVar1 != (fy_document_state *)0x0) {
    (pfVar1->fyt_td)._lh.next = &(pfVar1->fyt_td)._lh;
    (pfVar1->fyt_td)._lh.prev = &(pfVar1->fyt_td)._lh;
    pfVar1->refs = 1;
  }
  return pfVar1;
}

Assistant:

struct fy_document_state *fy_document_state_alloc(void) {
    struct fy_document_state *fyds;

    fyds = malloc(sizeof(*fyds));
    if (!fyds)
        return NULL;
    memset(fyds, 0, sizeof(*fyds));

    fyds->fyt_vd = NULL;
    fy_token_list_init(&fyds->fyt_td);

    fyds->refs = 1;

    return fyds;
}